

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O1

char * Ptr_AbcObjName(Abc_Obj_t *pObj)

{
  char *pcVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  int *piVar4;
  
  while( true ) {
    uVar2 = *(uint *)&pObj->field_0x14 & 0xf;
    if (((uVar2 == 6) || ((*(uint *)&pObj->field_0x14 & 0xe) == 8)) || (uVar2 == 10)) break;
    if ((uVar2 < 8) && ((0xa4U >> uVar2 & 1) != 0)) {
      pAVar3 = pObj->pNtk;
      piVar4 = (pObj->vFanouts).pArray;
    }
    else {
      if (uVar2 - 5 < 0xfffffffe) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacPtrAbc.c"
                      ,0x66,"char *Ptr_AbcObjName(Abc_Obj_t *)");
      }
      pAVar3 = pObj->pNtk;
      piVar4 = (pObj->vFanins).pArray;
    }
    pObj = (Abc_Obj_t *)pAVar3->vObjs->pArray[*piVar4];
  }
  pcVar1 = Abc_ObjName(pObj);
  return pcVar1;
}

Assistant:

char * Ptr_AbcObjName( Abc_Obj_t * pObj )
{
    if ( Abc_ObjIsNet(pObj) || Abc_ObjIsBox(pObj) )
        return Abc_ObjName(pObj);
    if ( Abc_ObjIsCi(pObj) || Abc_ObjIsNode(pObj) )
        return Ptr_AbcObjName(Abc_ObjFanout0(pObj));
    if ( Abc_ObjIsCo(pObj) )
        return Ptr_AbcObjName(Abc_ObjFanin0(pObj));
    assert( 0 );
    return NULL;
}